

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O2

from_chars_result __thiscall
semver::parse<int,int,int>(semver *this,string_view str,range_set<int,_int,_int> *out)

{
  pointer ptVar1;
  pointer ptVar2;
  pointer ptVar3;
  char *pcVar4;
  errc eVar5;
  from_chars_result fVar6;
  token_stream local_88;
  range_parser local_68;
  semver *local_48;
  _Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_> local_40;
  
  local_68.stream.tokens.
  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)str._M_len;
  local_88.tokens.super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.tokens.super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.current = 0;
  local_88.tokens.super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.stream.tokens.
  super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.stream.current = (size_t)this;
  fVar6 = detail::lexer::scan_tokens((lexer *)&local_68,&local_88);
  ptVar3 = local_88.tokens.
           super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage;
  ptVar2 = local_88.tokens.
           super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl
           .super__Vector_impl_data._M_finish;
  ptVar1 = local_88.tokens.
           super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl
           .super__Vector_impl_data._M_start;
  pcVar4 = fVar6.super_from_chars_result.ptr;
  eVar5 = fVar6.super_from_chars_result.ec;
  if (eVar5 == 0) {
    local_48 = (semver *)local_88.current;
    local_88.tokens.
    super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.tokens.
    super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.tokens.
    super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.stream.current = local_88.current;
    local_68.stream.tokens.
    super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
    super__Vector_impl_data._M_start = ptVar1;
    local_68.stream.tokens.
    super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
    super__Vector_impl_data._M_finish = ptVar2;
    local_68.stream.tokens.
    super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ptVar3;
    local_40._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_40._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_40._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    fVar6 = detail::range_parser::parse<int,int,int>
                      (&local_68,(range_set<int,_int,_int> *)str._M_str);
    pcVar4 = fVar6.super_from_chars_result.ptr;
    eVar5 = fVar6.super_from_chars_result.ec;
    std::_Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>::~_Vector_base
              (&local_68.stream.tokens.
                super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>);
    std::_Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>::~_Vector_base
              (&local_40);
  }
  std::_Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>::~_Vector_base
            (&local_88.tokens.
              super__Vector_base<semver::detail::token,_std::allocator<semver::detail::token>_>);
  fVar6.super_from_chars_result.ec = eVar5;
  fVar6.super_from_chars_result.ptr = pcVar4;
  fVar6.super_from_chars_result._12_4_ = 0;
  return (from_chars_result)fVar6.super_from_chars_result;
}

Assistant:

SEMVER_CONSTEXPR from_chars_result parse(std::string_view str, range_set<I1, I2, I3>& out) {
  detail::token_stream token_stream;
  const from_chars_result result =  detail::lexer{ str }.scan_tokens(token_stream);
  if (!result) {
    return result;
  }

  return detail::range_parser{ std::move(token_stream) }.parse(out);
}